

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool SpeedRSAKeyGen(string *selected)

{
  value_type vVar1;
  value_type vVar2;
  initializer_list<int> __l;
  bool bVar3;
  int iVar4;
  int iVar5;
  BIGNUM *pBVar6;
  reference piVar7;
  uint64_t uVar8;
  pointer prVar9;
  iterator __first;
  size_type sVar10;
  reference pvVar11;
  value_type local_230;
  uint64_t max;
  uint64_t median;
  uint64_t min;
  size_t n;
  TimeResults results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string description;
  value_type_conflict2 local_d8;
  uint64_t local_d0;
  uint64_t iteration_end;
  uint64_t iteration_start;
  UniquePtr<RSA> rsa;
  vector<unsigned_long,_std::allocator<unsigned_long>_> durations;
  uint64_t us;
  uint64_t num_calls;
  uint64_t start;
  const_iterator cStack_80;
  int size;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined4 local_60;
  undefined4 local_5c;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> kSizes;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_20;
  UniquePtr<BIGNUM> e;
  string *selected_local;
  
  e._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)selected;
  bVar3 = std::operator!=(selected,"RSAKeyGen");
  if (bVar3) {
    selected_local._7_1_ = 1;
  }
  else {
    pBVar6 = BN_new();
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_20,(pointer)pBVar6);
    pBVar6 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
    iVar4 = BN_set_word(pBVar6,0x10001);
    if (iVar4 == 0) {
      selected_local._7_1_ = 0;
      kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    else {
      __range1._4_4_ = 0x800;
      local_60 = 0xc00;
      local_5c = 0x1000;
      local_58 = (iterator)((long)&__range1 + 4);
      local_50 = 3;
      std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 3));
      __l._M_len = local_50;
      __l._M_array = local_58;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_48,__l,
                 (allocator<int> *)((long)&__range1 + 3));
      std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 3));
      __end1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_48);
      cStack_80 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_48);
      while (bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff80), bVar3) {
        piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end1);
        iVar4 = *piVar7;
        uVar8 = time_now();
        us = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa);
        do {
          prVar9 = (pointer)RSA_new();
          std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&iteration_start,prVar9);
          iteration_end = time_now();
          prVar9 = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&iteration_start);
          pBVar6 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
          iVar5 = RSA_generate_key_ex((RSA *)prVar9,iVar4,pBVar6,(BN_GENCB *)0x0);
          if (iVar5 == 0) {
            fprintf(_stderr,"RSA_generate_key_ex failed.\n");
            ERR_print_errors_fp(_stderr);
            selected_local._7_1_ = 0;
            kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._0_4_ = 1;
          }
          else {
            local_d0 = time_now();
            us = us + 1;
            local_d8 = local_d0 - iteration_end;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa,&local_d8);
            durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)(local_d0 - uVar8);
            if (durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < (pointer)0x1c9c381) {
              kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._0_4_ = 0;
            }
            else {
              kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._0_4_ = 4;
            }
          }
          std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&iteration_start);
        } while ((int)kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == 0);
        if ((int)kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == 4) {
          __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa);
          description.field_2._8_8_ =
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa);
          std::
          sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )description.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"RSA ",&local_149)
          ;
          std::__cxx11::to_string(&local_170,iVar4);
          std::operator+(&local_128,&local_148,&local_170);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190," key-gen",(allocator<char> *)((long)&results.us + 7));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_128,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator((allocator<char> *)((long)&results.us + 7));
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_148);
          std::allocator<char>::~allocator(&local_149);
          n = us;
          results.num_calls =
               (uint64_t)
               durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          TimeResults::Print((TimeResults *)&n,(string *)local_108);
          sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa);
          if (sVar10 == 0) {
            __assert_fail("n > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc"
                          ,0x1be,"bool SpeedRSAKeyGen(const std::string &)");
          }
          if ((g_print_json & 1U) == 0) {
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa,0);
            vVar1 = *pvVar11;
            if ((sVar10 & 1) == 0) {
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa,
                                   (sVar10 >> 1) - 1);
              vVar2 = *pvVar11;
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa,
                                   sVar10 >> 1);
              local_230 = vVar2 + *pvVar11 >> 1;
            }
            else {
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa,
                                   sVar10 >> 1);
              local_230 = *pvVar11;
            }
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa,
                                 sVar10 - 1);
            printf("  min: %luus, median: %luus, max: %luus\n",vVar1,local_230,*pvVar11);
          }
          std::__cxx11::string::~string((string *)local_108);
          kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 0;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rsa);
        if ((int)kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0013c00c;
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end1);
      }
      selected_local._7_1_ = 1;
      kSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
LAB_0013c00c:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48)
      ;
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  }
  return (bool)(selected_local._7_1_ & 1);
}

Assistant:

static bool SpeedRSAKeyGen(const std::string &selected) {
  // Don't run this by default because it's so slow.
  if (selected != "RSAKeyGen") {
    return true;
  }

  bssl::UniquePtr<BIGNUM> e(BN_new());
  if (!BN_set_word(e.get(), 65537)) {
    return false;
  }

  const std::vector<int> kSizes = {2048, 3072, 4096};
  for (int size : kSizes) {
    const uint64_t start = time_now();
    uint64_t num_calls = 0;
    uint64_t us;
    std::vector<uint64_t> durations;

    for (;;) {
      bssl::UniquePtr<RSA> rsa(RSA_new());

      const uint64_t iteration_start = time_now();
      if (!RSA_generate_key_ex(rsa.get(), size, e.get(), nullptr)) {
        fprintf(stderr, "RSA_generate_key_ex failed.\n");
        ERR_print_errors_fp(stderr);
        return false;
      }
      const uint64_t iteration_end = time_now();

      num_calls++;
      durations.push_back(iteration_end - iteration_start);

      us = iteration_end - start;
      if (us > 30 * 1000000 /* 30 secs */) {
        break;
      }
    }

    std::sort(durations.begin(), durations.end());
    const std::string description =
        std::string("RSA ") + std::to_string(size) + std::string(" key-gen");
    const TimeResults results = {num_calls, us};
    results.Print(description);
    const size_t n = durations.size();
    assert(n > 0);

    // Distribution information is useful, but doesn't fit into the standard
    // format used by |g_print_json|.
    if (!g_print_json) {
      uint64_t min = durations[0];
      uint64_t median = n & 1 ? durations[n / 2]
                              : (durations[n / 2 - 1] + durations[n / 2]) / 2;
      uint64_t max = durations[n - 1];
      printf("  min: %" PRIu64 "us, median: %" PRIu64 "us, max: %" PRIu64
             "us\n",
             min, median, max);
    }
  }

  return true;
}